

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

aiString * Read<aiString>(aiString *__return_storage_ptr__,IOStream *stream)

{
  IOStream *stream_local;
  aiString *s;
  
  aiString::aiString(__return_storage_ptr__);
  (*stream->_vptr_IOStream[2])(stream,__return_storage_ptr__,4,1);
  if (__return_storage_ptr__->length != 0) {
    (*stream->_vptr_IOStream[2])
              (stream,__return_storage_ptr__->data,(ulong)__return_storage_ptr__->length,1);
  }
  __return_storage_ptr__->data[__return_storage_ptr__->length] = '\0';
  return __return_storage_ptr__;
}

Assistant:

aiString Read<aiString>(IOStream * stream) {
    aiString s;
    stream->Read(&s.length,4,1);
    if(s.length)
        stream->Read(s.data,s.length,1);
    s.data[s.length] = 0;
    return s;
}